

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# progress.c
# Opt level: O1

int Curl_pgrsUpdate(connectdata *conn)

{
  int *piVar1;
  int iVar2;
  Curl_easy *data;
  FILE *whereto;
  undefined1 auVar3 [12];
  undefined8 uVar4;
  undefined4 uVar5;
  long seconds;
  bool bVar6;
  int iVar7;
  uint uVar8;
  long lVar9;
  timediff_t tVar10;
  ulong uVar11;
  long lVar12;
  curl_off_t cVar13;
  long lVar14;
  long lVar15;
  char (*max5_00) [10];
  long lVar16;
  ulong uVar17;
  long lVar18;
  curltime cVar19;
  curltime older;
  curltime newer;
  curltime newer_00;
  long local_a8;
  long local_a0;
  char time_spent [10];
  char time_total [10];
  char time_left [10];
  char max5 [6] [10];
  
  data = conn->data;
  iVar7 = (data->progress).speeder_c;
  lVar14 = (data->progress).downloaded;
  lVar12 = (data->progress).uploaded;
  cVar19 = Curl_now();
  lVar9 = cVar19.tv_sec;
  uVar4 = (data->progress).start.tv_sec;
  uVar5 = (data->progress).start.tv_usec;
  older.tv_usec = uVar5;
  older.tv_sec = uVar4;
  older._12_4_ = 0;
  auVar3 = cVar19._0_12_;
  newer._12_4_ = 0;
  newer.tv_sec = auVar3._0_8_;
  newer.tv_usec = auVar3._8_4_;
  tVar10 = Curl_timediff_us(newer,older);
  (data->progress).timespent = tVar10;
  seconds = tVar10 / 1000000;
  lVar15 = 999999;
  lVar18 = seconds;
  if (lVar14 < 0x20c49ba5e353f7) {
    lVar15 = 999;
    lVar14 = lVar14 * 1000;
    lVar18 = tVar10 / 1000;
  }
  if (tVar10 <= lVar15) {
    lVar18 = 1;
  }
  lVar15 = 999999;
  lVar16 = seconds;
  if (lVar12 < 0x20c49ba5e353f7) {
    lVar15 = 999;
    lVar12 = lVar12 * 1000;
    lVar16 = tVar10 / 1000;
  }
  if (tVar10 <= lVar15) {
    lVar16 = 1;
  }
  (data->progress).dlspeed = lVar14 / lVar18;
  (data->progress).ulspeed = lVar12 / lVar16;
  lVar14 = (data->progress).lastshow;
  if (lVar14 != lVar9) {
    iVar7 = iVar7 % 6;
    (data->progress).lastshow = lVar9;
    (data->progress).speeder[iVar7] = (data->progress).uploaded + (data->progress).downloaded;
    (data->progress).speeder_time[iVar7].tv_sec = lVar9;
    (data->progress).speeder_time[iVar7].tv_usec = cVar19.tv_usec;
    iVar2 = (data->progress).speeder_c;
    (data->progress).speeder_c = iVar2 + 1U;
    if (iVar2 == 0) {
      cVar13 = (data->progress).dlspeed + (data->progress).ulspeed;
    }
    else {
      uVar17 = 0;
      if (4 < iVar2) {
        uVar17 = (ulong)((iVar2 + 1U) % 6);
      }
      uVar11 = (ulong)(uint)((int)uVar17 << 4);
      cVar19.tv_usec = *(undefined4 *)((long)&(data->progress).speeder_time[0].tv_usec + uVar11);
      cVar19.tv_sec = *(undefined8 *)((long)&(data->progress).speeder_time[0].tv_sec + uVar11);
      cVar19._12_4_ = 0;
      newer_00._12_4_ = 0;
      newer_00.tv_sec = auVar3._0_8_;
      newer_00.tv_usec = auVar3._8_4_;
      tVar10 = Curl_timediff(newer_00,cVar19);
      lVar15 = tVar10 + (ulong)(tVar10 == 0);
      lVar12 = (data->progress).speeder[iVar7] - (data->progress).speeder[uVar17];
      if (lVar12 < 0x418938) {
        cVar13 = (lVar12 * 1000) / lVar15;
      }
      else {
        cVar13 = (curl_off_t)((double)lVar12 / ((double)lVar15 / 1000.0));
      }
    }
    (data->progress).current_speed = cVar13;
  }
  uVar8 = (data->progress).flags;
  if ((uVar8 & 0x10) != 0) {
    return 0;
  }
  if ((data->set).fxferinfo == (curl_xferinfo_callback)0x0) {
    if ((data->set).fprogress == (curl_progress_callback)0x0) {
      bVar6 = false;
      max5_00 = (char (*) [10])0x0;
      if (lVar14 == lVar9) goto LAB_0010c307;
      if (-1 < (char)uVar8) {
        if ((data->state).resume_from != 0) {
          curl_mfprintf((data->set).err,"** Resuming transfer from byte position %ld\n");
        }
        curl_mfprintf((data->set).err,
                      "  %% Total    %% Received %% Xferd  Average Speed   Time    Time     Time  Current\n                                 Dload  Upload   Total   Spent    Left  Speed\n"
                     );
        piVar1 = &(data->progress).flags;
        *(byte *)piVar1 = (byte)*piVar1 | 0x80;
      }
      uVar8 = (data->progress).flags;
      if (((uVar8 & 0x20) == 0) || (lVar14 = (data->progress).ulspeed, lVar14 < 1)) {
        local_a8 = 0;
        lVar14 = 0;
      }
      else {
        uVar17 = (data->progress).size_ul;
        lVar14 = (long)uVar17 / lVar14;
        if ((long)uVar17 < 0x2711) {
          if ((long)uVar17 < 1) {
            local_a8 = 0;
            goto LAB_0010c3ee;
          }
          cVar13 = (data->progress).uploaded * 100;
        }
        else {
          cVar13 = (data->progress).uploaded;
          uVar17 = uVar17 / 100;
        }
        local_a8 = cVar13 / (long)uVar17;
      }
LAB_0010c3ee:
      if (((uVar8 & 0x40) == 0) || (lVar12 = (data->progress).dlspeed, lVar12 < 1)) {
        local_a0 = 0;
        lVar12 = 0;
      }
      else {
        uVar17 = (data->progress).size_dl;
        lVar12 = (long)uVar17 / lVar12;
        if ((long)uVar17 < 0x2711) {
          if ((long)uVar17 < 1) {
            local_a0 = 0;
            goto LAB_0010c46b;
          }
          cVar13 = (data->progress).downloaded * 100;
        }
        else {
          cVar13 = (data->progress).downloaded;
          uVar17 = uVar17 / 100;
        }
        local_a0 = cVar13 / (long)uVar17;
      }
LAB_0010c46b:
      if (lVar12 < lVar14) {
        lVar12 = lVar14;
      }
      cVar13 = 0;
      if (0 < lVar12) {
        cVar13 = lVar12 - seconds;
      }
      time2str(time_left,cVar13);
      time2str(time_total,lVar12);
      time2str(time_spent,seconds);
      uVar8 = (data->progress).flags;
      uVar17 = (&(data->progress).size_dl)[(ulong)((uVar8 & 0x40) == 0) * 2] +
               (&(data->progress).size_ul)[(ulong)((uVar8 & 0x20) == 0) * 2];
      lVar14 = (data->progress).uploaded + (data->progress).downloaded;
      if ((long)uVar17 < 0x2711) {
        if ((long)uVar17 < 1) {
          lVar14 = 0;
        }
        else {
          lVar14 = (lVar14 * 100) / (long)uVar17;
        }
      }
      else {
        lVar14 = lVar14 / (long)(uVar17 / 100);
      }
      whereto = (data->set).err;
      max5data(uVar17,max5[2]);
      max5data((data->progress).downloaded,max5[0]);
      max5data((data->progress).uploaded,max5[1]);
      max5data((data->progress).dlspeed,max5[3]);
      max5_00 = max5 + 4;
      max5data((data->progress).ulspeed,*max5_00);
      max5data((data->progress).current_speed,max5[5]);
      curl_mfprintf(whereto,"\r%3ld %s  %3ld %s  %3ld %s  %s  %s %s %s %s %s",lVar14,max5 + 2,
                    local_a0,max5,local_a8,max5 + 1,max5 + 3,max5_00,time_total,time_spent,time_left
                    ,max5 + 5);
      fflush((FILE *)(data->set).err);
      bVar6 = true;
      goto LAB_0010c307;
    }
    Curl_set_in_callback(data,true);
    uVar8 = (*(data->set).fprogress)
                      ((data->set).progress_client,(double)(data->progress).size_dl,
                       (double)(data->progress).downloaded,(double)(data->progress).size_ul,
                       (double)(data->progress).uploaded);
  }
  else {
    Curl_set_in_callback(data,true);
    uVar8 = (*(data->set).fxferinfo)
                      ((data->set).progress_client,(data->progress).size_dl,
                       (data->progress).downloaded,(data->progress).size_ul,
                       (data->progress).uploaded);
  }
  max5_00 = (char (*) [10])(ulong)uVar8;
  bVar6 = false;
  Curl_set_in_callback(data,false);
  if (uVar8 != 0) {
    bVar6 = false;
    Curl_failf(data,"Callback aborted");
  }
LAB_0010c307:
  if (bVar6) {
    return 0;
  }
  return (int)max5_00;
}

Assistant:

int Curl_pgrsUpdate(struct connectdata *conn)
{
  struct curltime now;
  curl_off_t timespent;
  curl_off_t timespent_ms; /* milliseconds */
  struct Curl_easy *data = conn->data;
  int nowindex = data->progress.speeder_c% CURR_TIME;
  bool shownow = FALSE;
  curl_off_t dl = data->progress.downloaded;
  curl_off_t ul = data->progress.uploaded;

  now = Curl_now(); /* what time is it */

  /* The time spent so far (from the start) */
  data->progress.timespent = Curl_timediff_us(now, data->progress.start);
  timespent = (curl_off_t)data->progress.timespent/1000000; /* seconds */
  timespent_ms = (curl_off_t)data->progress.timespent/1000; /* ms */

  /* The average download speed this far */
  if(dl < CURL_OFF_T_MAX/1000)
    data->progress.dlspeed = (dl * 1000 / (timespent_ms>0?timespent_ms:1));
  else
    data->progress.dlspeed = (dl / (timespent>0?timespent:1));

  /* The average upload speed this far */
  if(ul < CURL_OFF_T_MAX/1000)
    data->progress.ulspeed = (ul * 1000 / (timespent_ms>0?timespent_ms:1));
  else
    data->progress.ulspeed = (ul / (timespent>0?timespent:1));

  /* Calculations done at most once a second, unless end is reached */
  if(data->progress.lastshow != now.tv_sec) {
    int countindex; /* amount of seconds stored in the speeder array */
    shownow = TRUE;

    data->progress.lastshow = now.tv_sec;

    /* Let's do the "current speed" thing, with the dl + ul speeds
       combined. Store the speed at entry 'nowindex'. */
    data->progress.speeder[ nowindex ] =
      data->progress.downloaded + data->progress.uploaded;

    /* remember the exact time for this moment */
    data->progress.speeder_time [ nowindex ] = now;

    /* advance our speeder_c counter, which is increased every time we get
       here and we expect it to never wrap as 2^32 is a lot of seconds! */
    data->progress.speeder_c++;

    /* figure out how many index entries of data we have stored in our speeder
       array. With N_ENTRIES filled in, we have about N_ENTRIES-1 seconds of
       transfer. Imagine, after one second we have filled in two entries,
       after two seconds we've filled in three entries etc. */
    countindex = ((data->progress.speeder_c >= CURR_TIME)?
                  CURR_TIME:data->progress.speeder_c) - 1;

    /* first of all, we don't do this if there's no counted seconds yet */
    if(countindex) {
      int checkindex;
      timediff_t span_ms;

      /* Get the index position to compare with the 'nowindex' position.
         Get the oldest entry possible. While we have less than CURR_TIME
         entries, the first entry will remain the oldest. */
      checkindex = (data->progress.speeder_c >= CURR_TIME)?
        data->progress.speeder_c%CURR_TIME:0;

      /* Figure out the exact time for the time span */
      span_ms = Curl_timediff(now,
                              data->progress.speeder_time[checkindex]);
      if(0 == span_ms)
        span_ms = 1; /* at least one millisecond MUST have passed */

      /* Calculate the average speed the last 'span_ms' milliseconds */
      {
        curl_off_t amount = data->progress.speeder[nowindex]-
          data->progress.speeder[checkindex];

        if(amount > CURL_OFF_T_C(4294967) /* 0xffffffff/1000 */)
          /* the 'amount' value is bigger than would fit in 32 bits if
             multiplied with 1000, so we use the double math for this */
          data->progress.current_speed = (curl_off_t)
            ((double)amount/((double)span_ms/1000.0));
        else
          /* the 'amount' value is small enough to fit within 32 bits even
             when multiplied with 1000 */
          data->progress.current_speed = amount*CURL_OFF_T_C(1000)/span_ms;
      }
    }
    else
      /* the first second we use the average */
      data->progress.current_speed =
        data->progress.ulspeed + data->progress.dlspeed;

  } /* Calculations end */

  if(!(data->progress.flags & PGRS_HIDE)) {
    /* progress meter has not been shut off */
    char max5[6][10];
    curl_off_t dlpercen = 0;
    curl_off_t ulpercen = 0;
    curl_off_t total_percen = 0;
    curl_off_t total_transfer;
    curl_off_t total_expected_transfer;
    char time_left[10];
    char time_total[10];
    char time_spent[10];
    curl_off_t ulestimate = 0;
    curl_off_t dlestimate = 0;
    curl_off_t total_estimate;

    if(data->set.fxferinfo) {
      int result;
      /* There's a callback set, call that */
      Curl_set_in_callback(data, true);
      result = data->set.fxferinfo(data->set.progress_client,
                                   data->progress.size_dl,
                                   data->progress.downloaded,
                                   data->progress.size_ul,
                                   data->progress.uploaded);
      Curl_set_in_callback(data, false);
      if(result)
        failf(data, "Callback aborted");
      return result;
    }
    if(data->set.fprogress) {
      int result;
      /* The older deprecated callback is set, call that */
      Curl_set_in_callback(data, true);
      result = data->set.fprogress(data->set.progress_client,
                                   (double)data->progress.size_dl,
                                   (double)data->progress.downloaded,
                                   (double)data->progress.size_ul,
                                   (double)data->progress.uploaded);
      Curl_set_in_callback(data, false);
      if(result)
        failf(data, "Callback aborted");
      return result;
    }

    if(!shownow)
      /* only show the internal progress meter once per second */
      return 0;

    /* If there's no external callback set, use internal code to show
       progress */

    if(!(data->progress.flags & PGRS_HEADERS_OUT)) {
      if(data->state.resume_from) {
        fprintf(data->set.err,
                "** Resuming transfer from byte position %"
                CURL_FORMAT_CURL_OFF_T "\n", data->state.resume_from);
      }
      fprintf(data->set.err,
              "  %% Total    %% Received %% Xferd  Average Speed   "
              "Time    Time     Time  Current\n"
              "                                 Dload  Upload   "
              "Total   Spent    Left  Speed\n");
      data->progress.flags |= PGRS_HEADERS_OUT; /* headers are shown */
    }

    /* Figure out the estimated time of arrival for the upload */
    if((data->progress.flags & PGRS_UL_SIZE_KNOWN) &&
       (data->progress.ulspeed > CURL_OFF_T_C(0))) {
      ulestimate = data->progress.size_ul / data->progress.ulspeed;

      if(data->progress.size_ul > CURL_OFF_T_C(10000))
        ulpercen = data->progress.uploaded /
          (data->progress.size_ul/CURL_OFF_T_C(100));
      else if(data->progress.size_ul > CURL_OFF_T_C(0))
        ulpercen = (data->progress.uploaded*100) /
          data->progress.size_ul;
    }

    /* ... and the download */
    if((data->progress.flags & PGRS_DL_SIZE_KNOWN) &&
       (data->progress.dlspeed > CURL_OFF_T_C(0))) {
      dlestimate = data->progress.size_dl / data->progress.dlspeed;

      if(data->progress.size_dl > CURL_OFF_T_C(10000))
        dlpercen = data->progress.downloaded /
          (data->progress.size_dl/CURL_OFF_T_C(100));
      else if(data->progress.size_dl > CURL_OFF_T_C(0))
        dlpercen = (data->progress.downloaded*100) /
          data->progress.size_dl;
    }

    /* Now figure out which of them is slower and use that one for the
       total estimate! */
    total_estimate = ulestimate>dlestimate?ulestimate:dlestimate;

    /* create the three time strings */
    time2str(time_left, total_estimate > 0?(total_estimate - timespent):0);
    time2str(time_total, total_estimate);
    time2str(time_spent, timespent);

    /* Get the total amount of data expected to get transferred */
    total_expected_transfer =
      (data->progress.flags & PGRS_UL_SIZE_KNOWN?
       data->progress.size_ul:data->progress.uploaded)+
      (data->progress.flags & PGRS_DL_SIZE_KNOWN?
       data->progress.size_dl:data->progress.downloaded);

    /* We have transferred this much so far */
    total_transfer = data->progress.downloaded + data->progress.uploaded;

    /* Get the percentage of data transferred so far */
    if(total_expected_transfer > CURL_OFF_T_C(10000))
      total_percen = total_transfer /
        (total_expected_transfer/CURL_OFF_T_C(100));
    else if(total_expected_transfer > CURL_OFF_T_C(0))
      total_percen = (total_transfer*100) / total_expected_transfer;

    fprintf(data->set.err,
            "\r"
            "%3" CURL_FORMAT_CURL_OFF_T " %s  "
            "%3" CURL_FORMAT_CURL_OFF_T " %s  "
            "%3" CURL_FORMAT_CURL_OFF_T " %s  %s  %s %s %s %s %s",
            total_percen,  /* 3 letters */                /* total % */
            max5data(total_expected_transfer, max5[2]),   /* total size */
            dlpercen,      /* 3 letters */                /* rcvd % */
            max5data(data->progress.downloaded, max5[0]), /* rcvd size */
            ulpercen,      /* 3 letters */                /* xfer % */
            max5data(data->progress.uploaded, max5[1]),   /* xfer size */
            max5data(data->progress.dlspeed, max5[3]),    /* avrg dl speed */
            max5data(data->progress.ulspeed, max5[4]),    /* avrg ul speed */
            time_total,    /* 8 letters */                /* total time */
            time_spent,    /* 8 letters */                /* time spent */
            time_left,     /* 8 letters */                /* time left */
            max5data(data->progress.current_speed, max5[5]) /* current speed */
            );

    /* we flush the output stream to make it appear as soon as possible */
    fflush(data->set.err);

  } /* !(data->progress.flags & PGRS_HIDE) */

  return 0;
}